

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O0

void __thiscall BloomFilter::BloomFilter(BloomFilter *this,SSTableDic *dic)

{
  bool bVar1;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  uint hash [4];
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  const_iterator __end1;
  const_iterator __begin1;
  SSTableDic *__range1;
  SSTableDic *dic_local;
  BloomFilter *this_local;
  
  std::bitset<81920UL>::bitset(&this->bits);
  __end1 = std::
           vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(dic);
  pair = (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end(dic);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&pair);
    if (!bVar1) break;
    hash._8_8_ = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator*(&__end1);
    memset(local_58 + 0x10,0,0x10);
    MurmurHash3_x64_128((void *)hash._8_8_,8,1,local_58 + 0x10);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_58,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_58,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_58);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_68,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_68,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_68);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_78,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_78,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_78);
    std::bitset<81920UL>::operator[]((bitset<81920UL> *)local_88,(size_t)this);
    std::bitset<81920UL>::reference::operator=((reference *)local_88,true);
    std::bitset<81920UL>::reference::~reference((reference *)local_88);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

BloomFilter::BloomFilter(const SSTableDic &dic) {
  for (const auto &pair : dic) {
    unsigned int hash[4] = {0};
    MurmurHash3_x64_128(&pair.first, sizeof(pair.first), 1, &hash);
    bits[hash[0] % (10240 * 8)] = true;
    bits[hash[1] % (10240 * 8)] = true;
    bits[hash[2] % (10240 * 8)] = true;
    bits[hash[3] % (10240 * 8)] = true;
  }
}